

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O1

QAccessibleInterface * __thiscall
QAccessibleAbstractScrollArea::childAt(QAccessibleAbstractScrollArea *this,int x,int y)

{
  QWidgetData *pQVar1;
  int *piVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  QPoint QVar6;
  QAccessibleInterface *pQVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QPoint local_68;
  undefined8 uStack_60;
  QWidgetList local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  if (((*(byte *)(*(long *)(lVar5 + 0x20) + 9) & 0x80) != 0) &&
     (iVar4 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x50))(this), 0 < iVar4)) {
    uVar8 = 0;
    do {
      accessibleChildren(&local_50,this);
      local_68.xp.m_i = 0;
      local_68.yp.m_i = 0;
      QVar6 = QWidget::mapToGlobal(local_50.d.ptr[uVar8],&local_68);
      piVar2 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),8,0x10);
        }
      }
      local_68 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      accessibleChildren(&local_50,this);
      piVar2 = (int *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d);
      pQVar1 = local_50.d.ptr[uVar8]->data;
      uStack_60 = (undefined1 *)
                  CONCAT44(((pQVar1->crect).y2.m_i + QVar6.yp.m_i.m_i) - (pQVar1->crect).y1.m_i,
                           ((pQVar1->crect).x2.m_i + QVar6.xp.m_i.m_i) - (pQVar1->crect).x1.m_i);
      local_68 = QVar6;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_50.d.d._4_4_,(int)local_50.d.d),8,0x10);
        }
      }
      local_50.d.d._0_4_ = x;
      local_50.d.d._4_4_ = y;
      cVar3 = QRect::contains(&local_68,SUB81(&local_50,0));
      if (cVar3 != '\0') {
        pQVar7 = (QAccessibleInterface *)
                 (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x48))
                           (this,uVar8 & 0xffffffff);
        goto LAB_00520483;
      }
      uVar8 = uVar8 + 1;
      iVar4 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x50))(this);
    } while ((long)uVar8 < (long)iVar4);
  }
  pQVar7 = (QAccessibleInterface *)0x0;
LAB_00520483:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar7;
}

Assistant:

QAccessibleInterface *QAccessibleAbstractScrollArea::childAt(int x, int y) const
{
    if (!abstractScrollArea()->isVisible())
        return nullptr;

    for (int i = 0; i < childCount(); ++i) {
        QPoint wpos = accessibleChildren().at(i)->mapToGlobal(QPoint(0, 0));
        QRect rect = QRect(wpos, accessibleChildren().at(i)->size());
        if (rect.contains(x, y))
            return child(i);
    }
    return nullptr;
}